

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O1

int ply_read_header_obj_info(p_ply_conflict ply)

{
  int iVar1;
  
  iVar1 = strcmp(ply->buffer + ply->buffer_token,"obj_info");
  if (iVar1 == 0) {
    iVar1 = ply_read_line(ply);
    if (iVar1 != 0) {
      iVar1 = ply_add_obj_info(ply,ply->buffer + ply->buffer_token);
      if (iVar1 != 0) {
        iVar1 = ply_read_word(ply);
        return iVar1;
      }
    }
  }
  return 0;
}

Assistant:

static int ply_read_header_obj_info(p_ply ply) {
    assert(ply && ply->fp && ply->io_mode == PLY_READ);
    if (strcmp(BWORD(ply), "obj_info")) return 0;
    if (!ply_read_line(ply)) return 0;
    if (!ply_add_obj_info(ply, BLINE(ply))) return 0;
    if (!ply_read_word(ply)) return 0;
    return 1;
}